

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkingDirectory.cxx
# Opt level: O2

void __thiscall cmWorkingDirectory::cmWorkingDirectory(cmWorkingDirectory *this,string *newdir)

{
  bool in_DL;
  string sStack_38;
  
  (this->OldDir)._M_dataplus._M_p = (pointer)&(this->OldDir).field_2;
  (this->OldDir)._M_string_length = 0;
  (this->OldDir).field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&sStack_38,(SystemTools *)0x1,in_DL);
  std::__cxx11::string::operator=((string *)this,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  SetDirectory(this,newdir);
  return;
}

Assistant:

cmWorkingDirectory::cmWorkingDirectory(std::string const& newdir)
{
  this->OldDir = cmSystemTools::GetCurrentWorkingDirectory();
  this->SetDirectory(newdir);
}